

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SmallVector.h
# Opt level: O2

pointer __thiscall
slang::SmallVectorBase<slang::ast::CoverageOptionSetter>::
emplaceRealloc<slang::ast::Scope_const&,slang::syntax::CoverageOptionSyntax_const&>
          (SmallVectorBase<slang::ast::CoverageOptionSetter> *this,pointer pos,Scope *args,
          CoverageOptionSyntax *args_1)

{
  CoverageOptionSetter *this_00;
  ulong uVar1;
  size_type sVar2;
  undefined8 *puVar3;
  CoverageOptionSyntax *pCVar4;
  pointer pCVar5;
  pointer pCVar6;
  pointer pCVar7;
  long lVar8;
  ulong capacity;
  
  if (this->len == 0x7fffffffffffffff) {
    detail::throwLengthError();
  }
  capacity = this->len + 1;
  uVar1 = this->cap;
  if (capacity < uVar1 * 2) {
    capacity = uVar1 * 2;
  }
  if (0x7fffffffffffffff - uVar1 < uVar1) {
    capacity = 0x7fffffffffffffff;
  }
  lVar8 = (long)pos - (long)this->data_;
  pCVar5 = (pointer)detail::allocArray(capacity,0x18);
  this_00 = (CoverageOptionSetter *)((long)pCVar5 + lVar8);
  ast::CoverageOptionSetter::CoverageOptionSetter(this_00,args,args_1);
  pCVar6 = this->data_;
  pCVar7 = pCVar5;
  if (pCVar6 + this->len == pos) {
    for (; pCVar6 != pos; pCVar6 = pCVar6 + 1) {
      pCVar7->expr = pCVar6->expr;
      pCVar4 = (pCVar6->syntax).ptr;
      (pCVar7->scope).ptr = (pCVar6->scope).ptr;
      (pCVar7->syntax).ptr = pCVar4;
      pCVar7 = pCVar7 + 1;
    }
  }
  else {
    for (; pCVar6 != pos; pCVar6 = pCVar6 + 1) {
      pCVar7->expr = pCVar6->expr;
      pCVar4 = (pCVar6->syntax).ptr;
      (pCVar7->scope).ptr = (pCVar6->scope).ptr;
      (pCVar7->syntax).ptr = pCVar4;
      pCVar7 = pCVar7 + 1;
    }
    sVar2 = this->len;
    pCVar6 = this->data_;
    puVar3 = (undefined8 *)((long)pCVar5 + lVar8);
    for (; pos != pCVar6 + sVar2; pos = pos + 1) {
      puVar3[5] = pos->expr;
      pCVar4 = (pos->syntax).ptr;
      puVar3[3] = (pos->scope).ptr;
      puVar3[4] = pCVar4;
      puVar3 = puVar3 + 3;
    }
  }
  cleanup(this,(EVP_PKEY_CTX *)args);
  this->len = this->len + 1;
  this->cap = capacity;
  this->data_ = pCVar5;
  return this_00;
}

Assistant:

typename SmallVectorBase<T>::pointer SmallVectorBase<T>::emplaceRealloc(const pointer pos,
                                                                        Args&&... args) {
    if (len == max_size())
        detail::throwLengthError();

    auto newCap = calculateGrowth(len + 1);
    auto offset = static_cast<size_type>(pos - begin());
    auto newData = (pointer)detail::allocArray(newCap, sizeof(T));

    // First construct the new element in the new memory,
    // so that we don't corrupt the new element if it relied on
    // existing elements we're about to move around.
    auto newPos = newData + offset;
    new (newPos) T(std::forward<Args>(args)...);

    // Now move elements to the new memory.
    if (pos == end()) {
        std::uninitialized_move(begin(), end(), newData);
    }
    else {
        std::uninitialized_move(begin(), pos, newData);
        std::uninitialized_move(pos, end(), newPos + 1);
    }

    cleanup();
    len++;
    cap = newCap;
    data_ = newData;
    return newPos;
}